

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_cdef_v2(opj_jp2_v2_t *jp2,uchar *p_cdef_header_data,OPJ_UINT32 p_cdef_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *p_value;
  ulong in_RAX;
  opj_jp2_cdef_info_t *poVar1;
  opj_jp2_cdef_t *poVar2;
  OPJ_BYTE *p_buffer;
  opj_bool oVar3;
  unsigned_short uVar4;
  ulong uVar5;
  unsigned_short *puVar6;
  OPJ_UINT32 l_value;
  undefined8 uStack_38;
  
  oVar3 = 0;
  if ((jp2->color).jp2_cdef == (opj_jp2_cdef_t *)0x0) {
    uStack_38 = in_RAX;
    opj_read_bytes_LE(p_cdef_header_data,(OPJ_UINT32 *)((long)&uStack_38 + 4),2);
    uVar4 = (unsigned_short)(uStack_38 >> 0x20);
    if (uVar4 == 0) {
      oVar3 = 0;
      opj_event_msg_v2(p_manager,1,"Number of channel description is equal to zero in CDEF box.\n");
    }
    else {
      poVar1 = (opj_jp2_cdef_info_t *)malloc((uStack_38 >> 0x20) * 6);
      poVar2 = (opj_jp2_cdef_t *)malloc(0x10);
      (jp2->color).jp2_cdef = poVar2;
      poVar2->info = poVar1;
      poVar2->n = uVar4;
      oVar3 = 1;
      if (uVar4 != 0) {
        puVar6 = &poVar1->asoc;
        p_buffer = p_cdef_header_data + 6;
        uVar5 = 0;
        p_value = (OPJ_UINT32 *)((long)&uStack_38 + 4);
        do {
          opj_read_bytes_LE(p_buffer + -4,p_value,2);
          ((opj_jp2_cdef_info_t *)(puVar6 + -2))->cn = uStack_38._4_2_;
          opj_read_bytes_LE(p_buffer + -2,p_value,2);
          puVar6[-1] = uStack_38._4_2_;
          opj_read_bytes_LE(p_buffer,p_value,2);
          *puVar6 = uStack_38._4_2_;
          uVar5 = uVar5 + 1;
          puVar6 = puVar6 + 3;
          p_buffer = p_buffer + 6;
        } while (uVar5 < ((jp2->color).jp2_cdef)->n);
      }
    }
  }
  return oVar3;
}

Assistant:

static opj_bool jp2_read_cdef_v2(	opj_jp2_v2_t * jp2,
							unsigned char * p_cdef_header_data,
							OPJ_UINT32 p_cdef_header_size,
							opj_event_mgr_t * p_manager
						  )
{
	opj_jp2_cdef_info_t *cdef_info;
	unsigned short i;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(jp2 != 00);
	assert(p_cdef_header_data != 00);
	assert(p_manager != 00);

	/* Part 1, I.5.3.6: 'The shall be at most one Channel Definition box
	 * inside a JP2 Header box.'*/
	if(jp2->color.jp2_cdef) return OPJ_FALSE;

	opj_read_bytes(p_cdef_header_data,&l_value ,2);			/* N */
	p_cdef_header_data+= 2;

	if ( (OPJ_UINT16)l_value == 0){ /* szukw000: FIXME */
		opj_event_msg_v2(p_manager, EVT_ERROR, "Number of channel description is equal to zero in CDEF box.\n");
		return OPJ_FALSE;
	}

	cdef_info = (opj_jp2_cdef_info_t*) opj_malloc(l_value * sizeof(opj_jp2_cdef_info_t));

	jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
	jp2->color.jp2_cdef->info = cdef_info;
	jp2->color.jp2_cdef->n = (OPJ_UINT16) l_value;

	for(i = 0; i < jp2->color.jp2_cdef->n; ++i) {
		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Cn^i */
		p_cdef_header_data +=2;
		cdef_info[i].cn = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Typ^i */
		p_cdef_header_data +=2;
		cdef_info[i].typ = (OPJ_UINT16) l_value;

		opj_read_bytes(p_cdef_header_data, &l_value, 2);			/* Asoc^i */
		p_cdef_header_data +=2;
		cdef_info[i].asoc = (OPJ_UINT16) l_value;
   }

	return OPJ_TRUE;
}